

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O1

bool bssl::hkdf_expand_label
               (Span<unsigned_char> out,EVP_MD *digest,Span<const_unsigned_char> secret,
               string_view label,Span<const_unsigned_char> hash,bool is_dtls)

{
  int iVar1;
  undefined7 in_register_00000089;
  bool bVar2;
  uint8_t *hkdf_label;
  EVP_MD *local_b8;
  uint8_t *local_b0;
  size_t local_a8;
  uint8_t *local_a0;
  size_t local_98;
  CBB cbb;
  CBB child;
  
  local_a8 = secret.size_;
  local_b0 = secret.data_;
  if ((int)CONCAT71(in_register_00000089,is_dtls) == 0) {
    iVar1 = CRYPTO_tls13_hkdf_expand_label
                      (out.data_,out.size_,digest,local_b0,local_a8,(uint8_t *)label._M_str,
                       label._M_len,hash.data_,hash.size_);
LAB_00166b5d:
    bVar2 = iVar1 == 1;
  }
  else {
    local_a0 = (uint8_t *)label._M_str;
    hkdf_label = (uint8_t *)0x0;
    local_b8 = digest;
    CBB_zero(&cbb);
    iVar1 = CBB_init(&cbb,label._M_len + hash.size_ + 10);
    if (iVar1 != 0) {
      iVar1 = CBB_add_u16(&cbb,(uint16_t)out.size_);
      if (iVar1 != 0) {
        iVar1 = CBB_add_u8_length_prefixed(&cbb,&child);
        if (iVar1 != 0) {
          iVar1 = CBB_add_bytes(&child,(uint8_t *)"dtls13",6);
          if (iVar1 != 0) {
            iVar1 = CBB_add_bytes(&child,local_a0,label._M_len);
            if (iVar1 != 0) {
              iVar1 = CBB_add_u8_length_prefixed(&cbb,&child);
              if (iVar1 != 0) {
                iVar1 = CBB_add_bytes(&child,hash.data_,hash.size_);
                if (iVar1 != 0) {
                  iVar1 = CBB_finish(&cbb,&hkdf_label,&local_98);
                  if (iVar1 != 0) {
                    iVar1 = HKDF_expand(out.data_,out.size_,local_b8,local_b0,local_a8,hkdf_label,
                                        local_98);
                    OPENSSL_free(hkdf_label);
                    goto LAB_00166b5d;
                  }
                }
              }
            }
          }
        }
      }
    }
    CBB_cleanup(&cbb);
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool hkdf_expand_label(Span<uint8_t> out, const EVP_MD *digest,
                              Span<const uint8_t> secret,
                              std::string_view label, Span<const uint8_t> hash,
                              bool is_dtls) {
  if (is_dtls) {
    return hkdf_expand_label_with_prefix(out, digest, secret, "dtls13", label,
                                         hash);
  }
  return CRYPTO_tls13_hkdf_expand_label(
             out.data(), out.size(), digest, secret.data(), secret.size(),
             reinterpret_cast<const uint8_t *>(label.data()), label.size(),
             hash.data(), hash.size()) == 1;
}